

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

cl_int parseILString(char *originalStr,cl_name_version_khr *ptr,size_t param_value_size,
                    size_t *param_value_size_ret)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  cl_int cVar7;
  char cVar8;
  char *pcVar9;
  ulong uVar10;
  
  cVar7 = 0;
  if (originalStr == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    cVar8 = *originalStr;
    uVar5 = 0;
    pcVar9 = originalStr;
    if (cVar8 != '\0') {
      do {
        iVar1 = isspace((int)cVar8);
        if (iVar1 == 0) {
LAB_00187d27:
          do {
            iVar1 = isspace((int)cVar8);
            if (iVar1 != 0) goto LAB_00187d43;
            cVar8 = pcVar9[1];
            pcVar9 = pcVar9 + 1;
          } while (cVar8 != '\0');
          cVar8 = '\0';
LAB_00187d43:
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        else {
          do {
            cVar8 = pcVar9[1];
            pcVar9 = pcVar9 + 1;
            iVar1 = isspace((int)cVar8);
          } while (iVar1 != 0);
          if (cVar8 != '\0') goto LAB_00187d27;
          cVar8 = '\0';
        }
      } while (cVar8 != '\0');
      uVar5 = (long)(int)uVar5 * 0x44;
    }
  }
  if (ptr != (cl_name_version_khr *)0x0) {
    cVar7 = -0x1e;
    if (uVar5 <= param_value_size) {
      cVar7 = 0;
    }
    if (uVar5 <= param_value_size && originalStr != (char *)0x0) {
      cVar8 = *originalStr;
      cVar7 = 0;
      if (cVar8 != '\0') {
        do {
          iVar1 = isspace((int)cVar8);
          if (iVar1 == 0) {
LAB_00187dd7:
            ptr->name[0x30] = '\0';
            ptr->name[0x31] = '\0';
            ptr->name[0x32] = '\0';
            ptr->name[0x33] = '\0';
            ptr->name[0x34] = '\0';
            ptr->name[0x35] = '\0';
            ptr->name[0x36] = '\0';
            ptr->name[0x37] = '\0';
            ptr->name[0x38] = '\0';
            ptr->name[0x39] = '\0';
            ptr->name[0x3a] = '\0';
            ptr->name[0x3b] = '\0';
            ptr->name[0x3c] = '\0';
            ptr->name[0x3d] = '\0';
            ptr->name[0x3e] = '\0';
            ptr->name[0x3f] = '\0';
            ptr->name[0x20] = '\0';
            ptr->name[0x21] = '\0';
            ptr->name[0x22] = '\0';
            ptr->name[0x23] = '\0';
            ptr->name[0x24] = '\0';
            ptr->name[0x25] = '\0';
            ptr->name[0x26] = '\0';
            ptr->name[0x27] = '\0';
            ptr->name[0x28] = '\0';
            ptr->name[0x29] = '\0';
            ptr->name[0x2a] = '\0';
            ptr->name[0x2b] = '\0';
            ptr->name[0x2c] = '\0';
            ptr->name[0x2d] = '\0';
            ptr->name[0x2e] = '\0';
            ptr->name[0x2f] = '\0';
            ptr->name[0x10] = '\0';
            ptr->name[0x11] = '\0';
            ptr->name[0x12] = '\0';
            ptr->name[0x13] = '\0';
            ptr->name[0x14] = '\0';
            ptr->name[0x15] = '\0';
            ptr->name[0x16] = '\0';
            ptr->name[0x17] = '\0';
            ptr->name[0x18] = '\0';
            ptr->name[0x19] = '\0';
            ptr->name[0x1a] = '\0';
            ptr->name[0x1b] = '\0';
            ptr->name[0x1c] = '\0';
            ptr->name[0x1d] = '\0';
            ptr->name[0x1e] = '\0';
            ptr->name[0x1f] = '\0';
            ptr->name[0] = '\0';
            ptr->name[1] = '\0';
            ptr->name[2] = '\0';
            ptr->name[3] = '\0';
            ptr->name[4] = '\0';
            ptr->name[5] = '\0';
            ptr->name[6] = '\0';
            ptr->name[7] = '\0';
            ptr->name[8] = '\0';
            ptr->name[9] = '\0';
            ptr->name[10] = '\0';
            ptr->name[0xb] = '\0';
            ptr->name[0xc] = '\0';
            ptr->name[0xd] = '\0';
            ptr->name[0xe] = '\0';
            ptr->name[0xf] = '\0';
            uVar10 = 0;
            while (((cVar8 = *originalStr, cVar8 != '\0' && (cVar8 != '_')) &&
                   (iVar1 = isspace((int)cVar8), iVar1 == 0))) {
              if (uVar10 < 0x40) {
                ptr->name[uVar10] = cVar8;
              }
              originalStr = originalStr + 1;
              uVar10 = uVar10 + 1;
            }
            ptr->name[0x3f] = '\0';
            if (*originalStr == '_') {
              cVar8 = originalStr[1];
              uVar2 = 0;
              iVar1 = 0;
              while( true ) {
                pcVar9 = originalStr + 1;
                if (9 < (int)cVar8 - 0x30U) break;
                iVar1 = ((int)cVar8 - 0x30U) + iVar1 * 10;
                cVar8 = pcVar9[1];
                originalStr = pcVar9;
              }
              pcVar4 = originalStr + 2;
              if (cVar8 != '.') {
                pcVar4 = pcVar9;
              }
              cVar8 = *pcVar4;
              uVar6 = (int)cVar8 - 0x30;
              if (uVar6 < 10) {
                uVar2 = 0;
                do {
                  uVar2 = uVar6 + uVar2 * 10;
                  cVar8 = pcVar4[1];
                  pcVar4 = pcVar4 + 1;
                  uVar6 = (int)cVar8 - 0x30;
                } while (uVar6 < 10);
              }
              originalStr = pcVar4 + (cVar8 == '.');
              uVar6 = (int)pcVar4[cVar8 == '.'] - 0x30;
              if (9 < uVar6) goto LAB_00187ec8;
              uVar3 = 0;
              do {
                uVar3 = uVar6 + uVar3 * 10;
                pcVar9 = originalStr + 1;
                originalStr = originalStr + 1;
                uVar6 = (int)*pcVar9 - 0x30;
              } while (uVar6 < 10);
              uVar3 = uVar3 & 0xfff;
            }
            else {
              iVar1 = 0;
              uVar2 = 0;
LAB_00187ec8:
              uVar3 = 0;
            }
            ptr->version = (uVar2 & 0x3ff) << 0xc | iVar1 << 0x16 | uVar3;
            cVar8 = *originalStr;
            while (cVar8 != '\0') {
              iVar1 = isspace((int)cVar8);
              if (iVar1 != 0) goto LAB_00187efd;
              pcVar9 = originalStr + 1;
              originalStr = originalStr + 1;
              cVar8 = *pcVar9;
            }
            cVar8 = '\0';
LAB_00187efd:
            ptr = ptr + 1;
          }
          else {
            do {
              cVar8 = originalStr[1];
              originalStr = originalStr + 1;
              iVar1 = isspace((int)cVar8);
            } while (iVar1 != 0);
            if (cVar8 != '\0') goto LAB_00187dd7;
            cVar8 = '\0';
          }
        } while (cVar8 != '\0');
        cVar7 = 0;
      }
    }
  }
  if (param_value_size_ret != (size_t *)0x0) {
    *param_value_size_ret = uVar5;
  }
  return cVar7;
}

Assistant:

static cl_int parseILString(
    const char* originalStr,
    cl_name_version_khr* ptr,
    size_t param_value_size,
    size_t* param_value_size_ret )
{
    cl_int  errorCode = CL_SUCCESS;

    // Go through the string once to count the number of tokens:
    const char* str = originalStr;
    int     numTokens = 0;
    while( str != NULL && str[0] != '\0' )
    {
        // Skip any preceding spaces
        while( isspace(str[0]) )
        {
            str++;
        }
        if( str[0] != '\0' )
        {
            // Find the next space, or end of string
            size_t  nameSize = 0;
            while( str[0] != '\0' && !isspace(str[0]) )
            {
                str++;
                nameSize++;
            }
            CLI_ASSERT( nameSize < CL_NAME_VERSION_MAX_NAME_SIZE_KHR );
            numTokens++;
        }
    }

    if( ptr != NULL )
    {
        if( param_value_size < numTokens * sizeof(cl_name_version_khr) )
        {
            errorCode = CL_INVALID_VALUE;
        }
        else
        {
            str = originalStr;
            while( str != NULL && str[0] != '\0' )
            {
                // skip any preceding spaces
                while( isspace(str[0]) )
                {
                    str++;
                }
                if( str[0] != '\0' )
                {
                    memset(ptr->name, 0, sizeof(ptr->name));

                    // find the next space, underscore, or end of string
                    size_t  nameSize = 0;
                    while( str[0] != '\0' && str[0] != '_' && !isspace(str[0]) )
                    {
                        if( nameSize < sizeof(ptr->name) )
                        {
                            ptr->name[nameSize] = str[0];
                        }
                        str++;
                        nameSize++;
                    }
                    ptr->name[sizeof(ptr->name) - 1] = '\0';

                    // version
                    cl_uint major = 0;
                    cl_uint minor = 0;
                    cl_uint patch = 0;
                    if( str[0] == '_' )
                    {
                        str++;
                        while( isdigit(str[0]) )
                        {
                            major *= 10;
                            major += str[0] - '0';
                            str++;
                        }
                        if( str[0] == '.' )
                        {
                            str++;
                        }
                        while( isdigit(str[0]) )
                        {
                            minor *= 10;
                            minor += str[0] - '0';
                            str++;
                        }
                        if( str[0] == '.' )
                        {
                            str++;
                        }
                        while( isdigit(str[0]) )
                        {
                            patch *= 10;
                            patch += str[0] - '0';
                            str++;
                        }
                    }
                    ptr->version = CL_MAKE_VERSION_KHR( major, minor, patch );

                    // find the next space or end of string
                    while( str[0] != '\0' && !isspace(str[0]) )
                    {
                        str++;
                    }

                    ptr++;
                }
            }
        }
    }
    if( param_value_size_ret != NULL )
    {
        *param_value_size_ret = numTokens * sizeof(cl_name_version_khr);
    }

    return errorCode;
}